

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::ConvertImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          uint32_t sampled_image_type_id)

{
  StorageClass storage_class;
  uint32_t type_id;
  TypeManager *pTVar1;
  Type *pTVar2;
  
  pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar2 = analysis::TypeManager::GetType(pTVar1,sampled_image_type_id);
  if ((pTVar2 != (Type *)0x0) &&
     (storage_class = GetStorageClass(this,image_variable), storage_class != Max)) {
    pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
    type_id = analysis::TypeManager::FindPointerToType(pTVar1,sampled_image_type_id,storage_class);
    MoveInstructionNextToType(this,image_variable,type_id);
    return true;
  }
  return false;
}

Assistant:

bool ConvertToSampledImagePass::ConvertImageVariableToSampledImage(
    Instruction* image_variable, uint32_t sampled_image_type_id) {
  auto* sampled_image_type =
      context()->get_type_mgr()->GetType(sampled_image_type_id);
  if (sampled_image_type == nullptr) return false;
  auto storage_class = GetStorageClass(*image_variable);
  if (storage_class == spv::StorageClass::Max) return false;
  // Make sure |image_variable| is behind its type i.e., avoid the forward
  // reference.
  uint32_t type_id = context()->get_type_mgr()->FindPointerToType(
      sampled_image_type_id, storage_class);
  MoveInstructionNextToType(image_variable, type_id);
  return true;
}